

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridFourier.cpp
# Opt level: O0

void __thiscall TasGrid::GridFourier::clearGpuCoefficients(GridFourier *this)

{
  bool bVar1;
  pointer pCVar2;
  pointer pCVar3;
  GridFourier *this_local;
  
  bVar1 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->gpu_cache);
  if (bVar1) {
    pCVar2 = ::std::
             unique_ptr<TasGrid::CudaFourierData<double>,_std::default_delete<TasGrid::CudaFourierData<double>_>_>
             ::operator->(&this->gpu_cache);
    GpuVector<double>::clear(&pCVar2->real);
    pCVar2 = ::std::
             unique_ptr<TasGrid::CudaFourierData<double>,_std::default_delete<TasGrid::CudaFourierData<double>_>_>
             ::operator->(&this->gpu_cache);
    GpuVector<double>::clear(&pCVar2->imag);
  }
  bVar1 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->gpu_cachef);
  if (bVar1) {
    pCVar3 = ::std::
             unique_ptr<TasGrid::CudaFourierData<float>,_std::default_delete<TasGrid::CudaFourierData<float>_>_>
             ::operator->(&this->gpu_cachef);
    GpuVector<float>::clear(&pCVar3->real);
    pCVar3 = ::std::
             unique_ptr<TasGrid::CudaFourierData<float>,_std::default_delete<TasGrid::CudaFourierData<float>_>_>
             ::operator->(&this->gpu_cachef);
    GpuVector<float>::clear(&pCVar3->imag);
  }
  return;
}

Assistant:

void GridFourier::clearGpuCoefficients() const{
    if (gpu_cache){
        gpu_cache->real.clear();
        gpu_cache->imag.clear();
    }
    if (gpu_cachef){
        gpu_cachef->real.clear();
        gpu_cachef->imag.clear();
    }
}